

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_unload_mesh(rf_mesh mesh,rf_allocator allocator)

{
  rf_mesh mesh_00;
  undefined1 auVar1 [104];
  uint *in_stack_fffffffffffffd98;
  void *local_18;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  local_18 = allocator.user_data;
  auVar1 = mesh._8_104_;
  mesh_00.vbo_id = in_stack_fffffffffffffd98;
  mesh_00.vertex_count = auVar1._0_4_;
  mesh_00.triangle_count = auVar1._4_4_;
  mesh_00.vertices = (float *)auVar1._8_8_;
  mesh_00.texcoords = (float *)auVar1._16_8_;
  mesh_00.texcoords2 = (float *)auVar1._24_8_;
  mesh_00.normals = (float *)auVar1._32_8_;
  mesh_00.tangents = (float *)auVar1._40_8_;
  mesh_00.colors = (uchar *)auVar1._48_8_;
  mesh_00.indices = (unsigned_short *)auVar1._56_8_;
  mesh_00.anim_vertices = (float *)auVar1._64_8_;
  mesh_00.anim_normals = (float *)auVar1._72_8_;
  mesh_00.bone_ids = (int *)auVar1._80_8_;
  mesh_00.bone_weights = (float *)auVar1._88_8_;
  mesh_00.vao_id = auVar1._96_4_;
  mesh_00._100_4_ = auVar1._100_4_;
  rf_gfx_unload_mesh(mesh_00);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  (*(code *)allocator_local.user_data)(&local_18,3);
  return;
}

Assistant:

RF_API void rf_unload_mesh(rf_mesh mesh, rf_allocator allocator)
{
    rf_gfx_unload_mesh(mesh);

    RF_FREE(allocator, mesh.vertices);
    RF_FREE(allocator, mesh.texcoords);
    RF_FREE(allocator, mesh.normals);
    RF_FREE(allocator, mesh.colors);
    RF_FREE(allocator, mesh.tangents);
    RF_FREE(allocator, mesh.texcoords2);
    RF_FREE(allocator, mesh.indices);

    RF_FREE(allocator, mesh.anim_vertices);
    RF_FREE(allocator, mesh.anim_normals);
    RF_FREE(allocator, mesh.bone_weights);
    RF_FREE(allocator, mesh.bone_ids);
    RF_FREE(allocator, mesh.vbo_id);
}